

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool ReplaceDefineInternal(char *lp,char *nl)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  CStringsList *pCVar10;
  byte bVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  bool bVar16;
  char *lp_local;
  byte local_79;
  char *local_78;
  int local_6c;
  char *kp;
  uint local_60;
  int local_5c;
  long local_58;
  char *local_50;
  char defarrayCountTxt [16];
  
  defarrayCountTxt[0] = '\0';
  defarrayCountTxt[1] = '\0';
  defarrayCountTxt[2] = '\0';
  defarrayCountTxt[3] = '\0';
  defarrayCountTxt[4] = '\0';
  defarrayCountTxt[5] = '\0';
  defarrayCountTxt[6] = '\0';
  defarrayCountTxt[7] = '\0';
  defarrayCountTxt[8] = '\0';
  defarrayCountTxt[9] = '\0';
  defarrayCountTxt[10] = '\0';
  defarrayCountTxt[0xb] = '\0';
  defarrayCountTxt[0xc] = '\0';
  defarrayCountTxt[0xd] = '\0';
  defarrayCountTxt[0xe] = '\0';
  defarrayCountTxt[0xf] = '\0';
  local_58 = -(long)nl;
  local_60 = 0;
  local_6c = 0;
  bVar12 = 1;
  lp_local = lp;
  local_78 = nl;
  local_50 = nl;
  while( true ) {
    while( true ) {
      while( true ) {
        pcVar9 = lp_local;
        bVar1 = *lp_local;
        uVar15 = (uint)bVar1;
        if ((bVar1 == 0) || (0x7ff < (long)nl - (long)local_50)) goto LAB_0011dcca;
        bVar11 = lp_local[1];
        iVar3 = isalnum(uVar15);
        bVar16 = iVar3 == 0;
        if (bVar11 != 0x2a || bVar1 != 0x2f) break;
        comlin = comlin + 1;
        bVar12 = bVar16;
        lp_local = pcVar9 + 2;
      }
      bVar11 = bVar11 ^ 0x2f;
      if (comlin == 0) break;
      bVar12 = bVar16;
      lp_local = pcVar9 + 1;
      if (bVar1 == 0x2a && bVar11 == 0) {
        pcVar7 = nl;
        if (comlin == 1) {
          pcVar7 = nl + 1;
          *nl = ' ';
          local_78 = pcVar7;
        }
        comlin = comlin + -1;
        nl = pcVar7;
        lp_local = pcVar9 + 2;
      }
    }
    if ((bVar1 == 0x3b) || (bVar1 == 0x2f && bVar11 == 0)) break;
    if (((bVar12 & 1) == 0) || ((uVar15 != 0x27 && (uVar15 != 0x22)))) {
      local_79 = bVar16;
      bVar16 = isLabelStart(pcVar9,false);
      if (bVar16) {
        kp = lp_local;
        uVar15 = 0;
        if ((bVar12 & 1) != 0) {
          iVar3 = cmphstr(&kp,"define+",false);
          uVar15 = 1;
          if (iVar3 == 0) {
            iVar3 = cmphstr(&kp,"define",false);
            uVar15 = 1;
            if (iVar3 == 0) {
              iVar3 = cmphstr(&kp,"undefine",false);
              uVar15 = 1;
              if (iVar3 == 0) {
                iVar3 = cmphstr(&kp,"defarray+",false);
                uVar15 = 1;
                if (iVar3 == 0) {
                  iVar3 = cmphstr(&kp,"defarray",false);
                  uVar15 = 1;
                  if (iVar3 == 0) {
                    iVar3 = cmphstr(&kp,"ifdef",false);
                    uVar15 = 1;
                    if (iVar3 == 0) {
                      iVar3 = cmphstr(&kp,"ifndef",false);
                      uVar15 = (uint)(iVar3 != 0);
                    }
                  }
                }
              }
            }
          }
        }
        local_60 = (byte)local_60 & 1 | uVar15;
        ResetGrowSubId();
        pcVar9 = lp_local;
        lVar13 = local_58;
        pcVar7 = lp_local;
        do {
          pcVar4 = GrowSubId(&lp_local);
          cVar2 = *pcVar4;
          if (((macrolabp == (char *)0x0) || (pcVar7 != pcVar9 && cVar2 == '_')) ||
             (pcVar5 = CMacroDefineTable::getverv(&MacroDefineTable,pcVar4), pcVar5 == (char *)0x0))
          {
            if (((pcVar7 == pcVar9 || cVar2 != '_') && (local_60 & 1) == 0) &&
               (pcVar5 = CDefineTable::Get(&DefineTable,pcVar4), pCVar10 = DefineTable.DefArrayList,
               pcVar5 != (char *)0x0)) {
              if (DefineTable.DefArrayList == (CStringsList *)0x0) goto LAB_0011da93;
              while (bVar16 = White(*lp_local), bVar16) {
                GrowSubIdByExtraChar(&lp_local);
              }
              if ((*lp_local == '[') ||
                 (Error("[ARRAY] Expression error",pcVar7,SUPPRESS), *lp_local == '[')) {
                if ((lp_local[1] == '#') && (lp_local[2] == ']')) {
                  lp_local = lp_local + 3;
                  uVar8 = 0;
                  for (; pCVar10 != (CStringsList *)0x0; pCVar10 = pCVar10->next) {
                    uVar8 = (ulong)((int)uVar8 + 1);
                  }
                  pcVar5 = defarrayCountTxt;
                  snprintf(pcVar5,0x10,"%d",uVar8);
                  goto LAB_0011da93;
                }
                lVar14 = 1;
              }
              else {
                lVar14 = 0;
              }
              pcVar5 = lp_local;
              IsLabelNotFound = false;
              if ((*lp_local == '[') &&
                 (pcVar6 = GrowSubIdByExtraChar(&lp_local), pcVar6 != (char *)0x0)) {
                if (IsSubstituting == true) {
                  __assert_fail("!IsSubstituting",
                                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                                ,0x18d,"int ParseExpressionInSubstitution(char *&, aint &)");
                }
                IsSubstituting = true;
                iVar3 = ParseExpressionNoSyntaxError(&lp_local,&local_5c);
                lVar13 = local_58;
                IsSubstituting = false;
                if (((iVar3 != 0) && (*lp_local == ']')) && (IsLabelNotFound == false)) {
                  lp_local = lp_local + 1;
                  for (; (0 < local_5c && (pCVar10 != (CStringsList *)0x0)); pCVar10 = pCVar10->next
                      ) {
                    local_5c = local_5c + -1;
                  }
                  if (pCVar10 == (CStringsList *)0x0 || local_5c < 0) {
                    defarrayCountTxt._0_8_ = defarrayCountTxt._0_8_ & 0xffffffffffffff00;
                    Error("[ARRAY] index not in 0..<Size-1> range",pcVar7,SUPPRESS);
                    pcVar5 = defarrayCountTxt;
                  }
                  else {
                    pcVar5 = pCVar10->string;
                  }
                  goto LAB_0011da93;
                }
              }
              lp_local = pcVar5 + lVar14;
              lVar13 = local_58;
              goto LAB_0011db7a;
            }
            iVar3 = islabchar(*lp_local);
            if (iVar3 == 0) {
              lp_local = pcVar7;
              ResetGrowSubId();
              pcVar4 = GrowSubId(&lp_local);
              goto LAB_0011db7a;
            }
          }
          else {
LAB_0011da93:
            local_6c = 1;
            pcVar4 = pcVar5;
LAB_0011db7a:
            pcVar7 = local_78 + lVar13;
            for (; (nl = local_78, cVar2 = *pcVar4, cVar2 != '\0' && ((long)pcVar7 < 0x800));
                pcVar7 = pcVar7 + 1) {
              pcVar4 = pcVar4 + 1;
              *local_78 = cVar2;
              local_78 = local_78 + 1;
            }
            ResetGrowSubId();
            pcVar7 = lp_local;
          }
          iVar3 = islabchar(*lp_local);
          bVar12 = local_79;
        } while (iVar3 != 0);
      }
      else {
        nl = local_78 + 1;
        *local_78 = *lp_local;
        bVar12 = local_79;
        lp_local = lp_local + 1;
        local_78 = nl;
      }
    }
    else {
      *nl = *pcVar9;
      lp_local = pcVar9 + 1;
      pcVar9 = nl;
      while( true ) {
        local_78 = pcVar9 + 1;
        bVar11 = *lp_local;
        if ((bVar11 == 0) || (bVar1 == bVar11)) break;
        pcVar7 = lp_local;
        pcVar4 = local_78;
        if ((bVar11 == 0x5c && bVar1 == 0x22) && (lp_local[1] != '\0')) {
          pcVar7 = lp_local + 1;
          pcVar4 = pcVar9 + 2;
          *local_78 = *lp_local;
        }
        lp_local = pcVar7 + 1;
        *pcVar4 = *pcVar7;
        pcVar9 = pcVar4;
      }
      nl = local_78;
      bVar12 = bVar16;
      if (bVar11 != 0) {
        nl = pcVar9 + 2;
        *local_78 = *lp_local;
        lp_local = lp_local + 1;
        local_78 = nl;
      }
    }
  }
  if ((pcVar9 < temp && (char *)0x18aa1f < pcVar9) && eolComment == (char *)0x0) {
    eolComment = pcVar9;
  }
LAB_0011dcca:
  pcVar9 = local_50;
  *local_78 = '\0';
  if (0x7ff < (long)(local_78 + (1 - (long)local_50))) {
    Error("line too long after macro expansion",local_50,SUPPRESS);
  }
  local_78 = pcVar9;
  iVar3 = SkipBlanks(&local_78);
  if (iVar3 != 0) {
    *pcVar9 = '\0';
  }
  substitutedLine = pcVar9;
  return local_6c != 0;
}

Assistant:

static bool ReplaceDefineInternal(char* lp, char* const nl) {
	int definegereplaced = 0,dr;
	char* rp = nl,* nid;
	const char* ver;
	bool isDefDir = false;	// to remember if one of DEFINE-related directives was used
	bool afterNonAlphaNum, afterNonAlphaNumNext = true;
	char defarrayCountTxt[16] = { 0 };
	while (*lp && ((rp - nl) < LINEMAX)) {
		const char c1 = lp[0], c2 = lp[1];
		afterNonAlphaNum = afterNonAlphaNumNext;
		afterNonAlphaNumNext = !isalnum((byte)c1);
		if (c1 == '/' && c2 == '*') {	// block-comment local beginning (++block_nesting)
			lp += 2;
			++comlin;
			continue;
		}
		if (comlin) {
			if (c1 == '*' && c2 == '/') {
				lp += 2;
				// insert space into line, if the block ending may have affected parsing of line
				if (1 == comlin) {
					*rp++ = ' ';		// ^^ otherwise this line is completely commented out
				}
				--comlin;	// decrement block comment counter
			} else {
				++lp;		// just skip all characters inside comment block
			}
			continue;
		}
		// for following code (0 == comlin) (unless it has its own parse loop)

		// single line comments -> finish
		if (c1 == ';' || (c1 == '/' && c2 == '/')) {
			// set empty eol line comment, if the source of data is still the original "line" buffer
			if (!eolComment && line <= lp && lp < line+LINEMAX) eolComment = lp;
			break;
		}

		// strings parsing
		if (afterNonAlphaNum && (c1 == '"' || c1 == '\'')) {
			*rp++ = *lp++;				// copy the string delimiter (" or ')
			// apostrophe inside apostrophes ('') will parse as end + start of another string
			// which sort of "accidentally" leads to correct final results
			while (*lp && c1 != *lp) {	// until end of current string is reached (or line ends)
				// inside double quotes the backslash should escape (anything after it)
				if ('"' == c1 && '\\' == *lp && lp[1]) *rp++ = *lp++;	// copy escaping backslash extra
				*rp++ = *lp++;			// copy string character
			}
			if (*lp) *rp++ = *lp++;		// copy the ending string delimiter (" or ')
			continue;
		}

		if (!isLabelStart(lp, false)) {
			*rp++ = *lp++;
			continue;
		}

		// update "is define-related directive" for remainder of the line
		char* kp = lp;
		isDefDir |= afterNonAlphaNum && (cmphstr(kp, "define+") || cmphstr(kp, "define")
			|| cmphstr(kp, "undefine") || cmphstr(kp, "defarray+") || cmphstr(kp, "defarray")
			|| cmphstr(kp, "ifdef") || cmphstr(kp, "ifndef"));
		// if DEFINE-related directive was used, only macro-arguments are substituted
		// in the remaining part of the line, the define-based substitution is inhibited till EOL

		// The following loop is recursive-like macro/define substitution, the `*lp` here points
		// at alphabet/underscore char, marking start of "id" string, and it will be parsed by
		// sub-id parts, delimited by underscores, each combination of consecutive sub-ids may
		// be substituted by some macro argument or define.

		//TODO - maybe consider the substitution search to go downward, from longest term to shortest subterm
		ResetGrowSubId();
		char* nextSubIdLp = lp, * wholeIdLp = lp;
		do { //while(islabchar(*lp));
			nid = GrowSubId(lp);		// grow the current sub-id part by part, checking each combination for substitution
			// defines/macro arguments can substitute in the middle of ID only if they don't start with underscore
			const bool canSubstituteInside = '_' != nid[0] || nextSubIdLp == wholeIdLp;
			if (macrolabp && canSubstituteInside && (ver = MacroDefineTable.getverv(nid))) {
				dr = 2;			// macro argument substitution is possible
			} else if (!isDefDir && canSubstituteInside && (ver = DefineTable.Get(nid))) {
				dr = 1;			// DEFINE substitution is possible
				//handle DEFARRAY case
				if (DefineTable.DefArrayList) {
					ver = nid;	// in case of some error, just copy the array id "as is"
					CStringsList* a = DefineTable.DefArrayList;
					while (White(*lp)) GrowSubIdByExtraChar(lp);
					aint val;
					if ('[' != *lp) Error("[ARRAY] Expression error", nextSubIdLp, SUPPRESS);
					if ('[' == *lp && '#' == lp[1] && ']' == lp[2]) {	// calculate size of defarray
						lp += 3;
						val = 0;
						while (a) {
							++val;
							a = a->next;
						}
						SPRINTF1(defarrayCountTxt, 16, "%d", val);
						ver = defarrayCountTxt;
					} else {
						char* expLp = lp + ('[' == *lp);	// the '[' will become part of subId in didParseBrackets
						IsLabelNotFound = false;
						bool didParseBrackets = '[' == *lp && GrowSubIdByExtraChar(lp) && ParseExpressionInSubstitution(lp, val) && ']' == *lp;
						if (didParseBrackets && !IsLabelNotFound) {
							// expression was successfully parsed and all values were known
							++lp;
							while (0 < val && a) {
								a = a->next;
								--val;
							}
							if (val < 0 || NULL == a) {
								*defarrayCountTxt = 0;		// substitute with empty string
								ver = defarrayCountTxt;
								Error("[ARRAY] index not in 0..<Size-1> range", nextSubIdLp, SUPPRESS);
							} else {
								ver = a->string;	// substitute with array value
							}
						} else {	// no substition of array possible at this time (index eval / syntax error)
							lp = expLp;				// restore lp in case expression parser went ahead a lot
							dr = -1;// write into output, but don't count as replacement
						}
					}
				}
			} else {
				dr = 0;			// no possible substitution found
				ver = nid;
			}
			// check if no substition was found, and there's no more chars to extend SubId
			if (0 == dr && !islabchar(*lp)) {
				lp = nextSubIdLp;		// was fully extended, no match, "eat" first subId
				ResetGrowSubId();
				ver = GrowSubId(lp);	// find the first SubId again, for the copy
				dr = -1;				// write into output, but don't count as replacement
			}
			if (0 < dr) definegereplaced = 1;		// above zero => count as replacement
			if (0 != dr) {				// any non-zero dr => write to the output
				while (*ver && ((rp - nl) < LINEMAX)) *rp++ = *ver++;		// replace the string into target buffer
				// reset subId parser to catch second+ subId in current Id
				ResetGrowSubId();
				nextSubIdLp = lp;
			}
			// continue with extending the subId, if there's still something to parse
		} while(islabchar(*lp));
	} // while(*lp)
	// add line terminator to the output buffer
	*rp++ = 0;
	if (LINEMAX <= (rp - nl)) {
		Error("line too long after macro expansion", nl, SUPPRESS);
	}
	// check if whole line is just blanks, then return just empty one
	rp = nl;
	if (SkipBlanks(rp)) *nl = 0;
	substitutedLine = nl;		// set global pointer to the latest substituted version
	return definegereplaced;
}